

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>::
ContIntLoadConstraint_C
          (ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *this
          ,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,double recovery_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChContactable_3vars<3,_3,_3> *pCVar5;
  ChContactable_1vars<3> *pCVar6;
  ChSystem *pCVar7;
  double *pdVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  double dVar30;
  Vector V2_w;
  Vector V1_w;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  auVar28._8_56_ = in_register_00001248;
  auVar28._0_8_ = recovery_clamp;
  auVar20 = auVar28._0_16_;
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = c;
  auVar17 = auVar23._0_16_;
  pCVar5 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
           ).objA;
  if (((pCVar5 != (ChContactable_3vars<3,_3,_3> *)0x0) &&
      ((this->
       super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>).
       objB != (ChContactable_1vars<3> *)0x0)) &&
     ((this->restitution != 0.0 || (NAN(this->restitution))))) {
    (*(pCVar5->super_ChContactable)._vptr_ChContactable[10])
              (&local_48,pCVar5,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                ).p1);
    pCVar6 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
             ).objB;
    (*(pCVar6->super_ChContactable)._vptr_ChContactable[10])
              (&local_60,pCVar6,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                ).p2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->
                   super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                   ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_60 - local_48;
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         (local_58 - local_40) *
         (this->
         super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
         ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar17 = vfmadd231sd_fma(auVar24,auVar18,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->
                   super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                   ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_50 - local_38;
    auVar17 = vfmadd231sd_fma(auVar17,auVar29,auVar2);
    pCVar7 = (((this->
               super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
               ).container)->super_ChPhysicsItem).system;
    dVar16 = auVar17._0_8_ * this->restitution;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = pCVar7->min_bounce_speed;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar17 = vxorpd_avx512vl(auVar25,auVar11);
    if ((dVar16 < auVar17._0_8_) &&
       (auVar26._8_8_ = 0, auVar26._0_8_ = pCVar7->step, auVar3._8_8_ = 0,
       auVar3._0_8_ = (this->
                      super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                      ).norm_dist, auVar19._8_8_ = 0, auVar19._0_8_ = dVar16,
       auVar17 = vfmadd213sd_fma(auVar26,auVar19,auVar3), auVar17._0_8_ < 0.0)) {
      if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)off_L) goto LAB_0056109e;
      goto LAB_00560ff8;
    }
    auVar17._8_8_ = 0;
    auVar17._0_8_ = c;
  }
  dVar16 = this->compliance;
  dVar30 = auVar17._0_8_;
  if ((dVar16 != 0.0) || (NAN(dVar16))) {
    dVar10 = 1.0 / dVar30 + this->dampingf;
    dVar30 = 1.0 / ((1.0 / dVar30) * dVar10);
    (this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar16 * dVar30;
    dVar30 = dVar30 * this->complianceT;
    (this->Tu).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar30;
    (this->Tv).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar30;
    if ((long)(ulong)off_L <
        (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      dVar16 = (1.0 / dVar10) *
               (this->
               super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
               ).norm_dist;
      auVar12._8_8_ = 0x8000000000000000;
      auVar12._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar20,auVar12);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar16;
      auVar17 = vmaxsd_avx(auVar20,auVar17);
      dVar16 = (double)((ulong)do_clamp * auVar17._0_8_ + (ulong)!do_clamp * (long)dVar16);
      goto LAB_00560ff8;
    }
  }
  else {
    if (do_clamp) {
      dVar16 = (this->Nx).super_ChConstraintTwoTuplesContactNall.cohesion;
      lVar9 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        if (lVar9 <= (long)(ulong)off_L) goto LAB_0056109e;
        auVar13._8_8_ = 0x8000000000000000;
        auVar13._0_8_ = 0x8000000000000000;
        auVar17 = vxorpd_avx512vl(auVar20,auVar13);
        auVar21._8_8_ = 0;
        auVar21._0_8_ =
             dVar30 * (this->
                      super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                      ).norm_dist;
        auVar17 = vmaxsd_avx(auVar21,auVar17);
        auVar17 = vminsd_avx(ZEXT816(0) << 0x40,auVar17);
        dVar16 = auVar17._0_8_;
      }
      else {
        if (lVar9 <= (long)(ulong)off_L) goto LAB_0056109e;
        auVar14._8_8_ = 0x8000000000000000;
        auVar14._0_8_ = 0x8000000000000000;
        auVar17 = vxorpd_avx512vl(auVar20,auVar14);
        auVar22._8_8_ = 0;
        auVar22._0_8_ =
             dVar30 * (this->
                      super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                      ).norm_dist;
        auVar17 = vmaxsd_avx(auVar22,auVar17);
        dVar16 = auVar17._0_8_;
      }
LAB_00560ff8:
      pdVar8 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar8[off_L] = dVar16 + pdVar8[off_L];
      return;
    }
    uVar15 = (ulong)off_L;
    if ((long)uVar15 <
        (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
           ).norm_dist;
      pdVar8 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar8[uVar15];
      auVar17 = vfmadd213sd_fma(auVar27,auVar17,auVar4);
      pdVar8[uVar15] = auVar17._0_8_;
      return;
    }
  }
LAB_0056109e:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual void ContIntLoadConstraint_C(const unsigned int off_L,  
                                         ChVectorDynamic<>& Qc,     
                                         const double c,            
                                         bool do_clamp,             
                                         double recovery_clamp      
                                         ) override {
        bool bounced = false;

        // Elastic Restitution model (use simple Newton model with coefficient e=v(+)/v(-))
        // Note that this works only if the two connected items are two ChBody.

        if (this->objA && this->objB) {
            if (this->restitution) {
                // compute normal rebounce speed
                Vector V1_w = this->objA->GetContactPointSpeed(this->p1);
                Vector V2_w = this->objB->GetContactPointSpeed(this->p2);
                Vector Vrel_w = V2_w - V1_w;
                Vector Vrel_cplane = this->contact_plane.transpose() * Vrel_w;

                double h = this->container->GetSystem()->GetStep();  // = 1.0 / c;  // not all steppers have c = 1/h

                double neg_rebounce_speed = Vrel_cplane.x() * this->restitution;
                if (neg_rebounce_speed < -this->container->GetSystem()->GetMinBounceSpeed())
                    if (this->norm_dist + neg_rebounce_speed * h < 0) {
                        // CASE: BOUNCE
                        bounced = true;
                        Qc(off_L) += neg_rebounce_speed;
                    }
            }
        }

        if (!bounced) {
            // CASE: SETTLE (most often, and also default if two colliding items are not two ChBody)

            if (this->compliance) {
                double h = 1.0 / c;  // was: this->container->GetSystem()->GetStep(); note not all steppers have c = 1/h

                double alpha = this->dampingf;              // [R]=alpha*[K]
                double inv_hpa = 1.0 / (h + alpha);         // 1/(h+a)
                double inv_hhpa = 1.0 / (h * (h + alpha));  // 1/(h*(h+a))

                //***TODO*** move to KRMmatricesLoad() the following, and only for !bounced case
                Nx.Set_cfm_i((inv_hhpa) * this->compliance);
                Tu.Set_cfm_i((inv_hhpa) * this->complianceT);
                Tv.Set_cfm_i((inv_hhpa) * this->complianceT);

                double qc = inv_hpa * this->norm_dist;  //***TODO*** see how to move this in KRMmatricesLoad()
				
                // Note: clamping of Qc in case of compliance is questionable: it does not limit only the outbound
                // speed, but also the reaction, so it might allow longer 'sinking' not related to the real compliance.
				// I.e. If clamping kicks in (when using large timesteps and low compliance), it acts as a numerical damping.
				if (do_clamp) {
					qc = ChMax(qc, -recovery_clamp);
				}

                Qc(off_L) += qc;

            } else {
                if (do_clamp)
                    if (this->Nx.GetCohesion())
                        Qc(off_L) += ChMin(0.0, ChMax(c * this->norm_dist, -recovery_clamp));
                    else
                        Qc(off_L) += ChMax(c * this->norm_dist, -recovery_clamp);
                else
                    Qc(off_L) += c * this->norm_dist;
            }
        }
    }